

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void color_tree_add(ColorTree *tree,uchar r,uchar g,uchar b,uchar a,uint index)

{
  uint uVar1;
  ColorTree *pCVar2;
  undefined3 in_register_00000009;
  undefined3 in_register_00000011;
  uint uVar3;
  undefined3 in_register_00000031;
  undefined7 in_register_00000081;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = CONCAT71(in_register_00000081,a);
  do {
    uVar1 = ((uint)uVar4 >> (uVar3 & 0x1f) & 1) +
            (CONCAT31(in_register_00000011,g) >> (uVar3 & 0x1f) & 1) * 4 +
            (CONCAT31(in_register_00000031,r) >> (uVar3 & 0x1f) & 1) * 8 +
            (CONCAT31(in_register_00000009,b) >> (uVar3 & 0x1f) & 1) * 2;
    if (tree->children[uVar1] == (ColorTree *)0x0) {
      pCVar2 = (ColorTree *)malloc(0x88);
      uVar4 = CONCAT71(in_register_00000081,a) & 0xffffffff;
      tree->children[uVar1] = pCVar2;
      pCVar2->children[0] = (ColorTree *)0x0;
      pCVar2->children[1] = (ColorTree *)0x0;
      pCVar2->children[2] = (ColorTree *)0x0;
      pCVar2->children[3] = (ColorTree *)0x0;
      pCVar2->children[4] = (ColorTree *)0x0;
      pCVar2->children[5] = (ColorTree *)0x0;
      pCVar2->children[6] = (ColorTree *)0x0;
      pCVar2->children[7] = (ColorTree *)0x0;
      pCVar2->children[8] = (ColorTree *)0x0;
      pCVar2->children[9] = (ColorTree *)0x0;
      pCVar2->children[10] = (ColorTree *)0x0;
      pCVar2->children[0xb] = (ColorTree *)0x0;
      pCVar2->children[0xc] = (ColorTree *)0x0;
      pCVar2->children[0xd] = (ColorTree *)0x0;
      pCVar2->children[0xe] = (ColorTree *)0x0;
      pCVar2->children[0xf] = (ColorTree *)0x0;
      pCVar2->index = -1;
    }
    tree = tree->children[uVar1];
    uVar3 = uVar3 + 1;
  } while (uVar3 != 8);
  tree->index = index;
  return;
}

Assistant:

static void color_tree_add(ColorTree* tree,
                           unsigned char r, unsigned char g, unsigned char b, unsigned char a, unsigned index)
{
  int bit;
  for(bit = 0; bit < 8; ++bit)
  {
    int i = 8 * ((r >> bit) & 1) + 4 * ((g >> bit) & 1) + 2 * ((b >> bit) & 1) + 1 * ((a >> bit) & 1);
    if(!tree->children[i])
    {
      tree->children[i] = (ColorTree*)lodepng_malloc(sizeof(ColorTree));
      color_tree_init(tree->children[i]);
    }
    tree = tree->children[i];
  }
  tree->index = (int)index;
}